

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall CServer::InitRconPasswordIfUnset(CServer *this)

{
  CServer *in_RDI;
  long in_FS_OFFSET;
  unsigned_short RandomNumber;
  size_t i;
  char aRandomPassword [7];
  unsigned_short aRandom [3];
  undefined6 in_stack_ffffffffffffffd0;
  ushort in_stack_ffffffffffffffd6;
  ulong local_28;
  char local_15 [7];
  ushort local_e [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->m_RconPasswordSet == 0) {
    dbg_assert_imp((char *)CONCAT26(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0),
                   (int)((ulong)in_RDI >> 0x20),(int)in_RDI,(char *)0x10ef0f);
    dbg_assert_imp((char *)CONCAT26(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0),
                   (int)((ulong)in_RDI >> 0x20),(int)in_RDI,(char *)0x10ef2c);
    local_15[6] = 0;
    secure_random_fill((void *)CONCAT26(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0),
                       (uint)((ulong)in_RDI >> 0x20));
    for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
      in_stack_ffffffffffffffd6 = local_e[local_28] % 0x800;
      *(char *)((long)local_e + local_28 * 2 + -7) =
           "ABCDEFGHKLMNPRSTUVWXYZabcdefghjkmnopqt23456789"[(ulong)in_stack_ffffffffffffffd6 / 0x2e]
      ;
      *(char *)(local_e + (local_28 - 3)) =
           "ABCDEFGHKLMNPRSTUVWXYZabcdefghjkmnopqt23456789"[(ulong)in_stack_ffffffffffffffd6 % 0x2e]
      ;
    }
    Config(in_RDI);
    str_copy((char *)CONCAT26(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0),(char *)in_RDI,0)
    ;
    in_RDI->m_GeneratedRconPassword = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CServer::InitRconPasswordIfUnset()
{
	if(m_RconPasswordSet)
	{
		return;
	}

	static const char VALUES[] = "ABCDEFGHKLMNPRSTUVWXYZabcdefghjkmnopqt23456789";
	static const size_t NUM_VALUES = sizeof(VALUES) - 1; // Disregard the '\0'.
	static const size_t PASSWORD_LENGTH = 6;
	dbg_assert(NUM_VALUES * NUM_VALUES >= 2048, "need at least 2048 possibilities for 2-character sequences");
	// With 6 characters, we get a password entropy of log(2048) * 6/2 = 33bit.

	dbg_assert(PASSWORD_LENGTH % 2 == 0, "need an even password length");
	unsigned short aRandom[PASSWORD_LENGTH / 2];
	char aRandomPassword[PASSWORD_LENGTH+1];
	aRandomPassword[PASSWORD_LENGTH] = 0;

	secure_random_fill(aRandom, sizeof(aRandom));
	for(size_t i = 0; i < PASSWORD_LENGTH / 2; i++)
	{
		unsigned short RandomNumber = aRandom[i] % 2048;
		aRandomPassword[2 * i + 0] = VALUES[RandomNumber / NUM_VALUES];
		aRandomPassword[2 * i + 1] = VALUES[RandomNumber % NUM_VALUES];
	}

	str_copy(Config()->m_SvRconPassword, aRandomPassword, sizeof(Config()->m_SvRconPassword));
	m_GeneratedRconPassword = 1;
}